

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

jpc_dec_cp_t * jpc_dec_cp_create(uint_fast16_t numcomps)

{
  jpc_dec_cp_t *cp;
  jpc_dec_ccp_t *pjVar1;
  jpc_pchglist_t *pjVar2;
  int iVar3;
  bool bVar4;
  
  cp = (jpc_dec_cp_t *)jas_malloc(0x30);
  if (cp != (jpc_dec_cp_t *)0x0) {
    cp->flags = 0;
    cp->numcomps = (int)numcomps;
    cp->prgord = '\0';
    cp->numlyrs = 0;
    cp->mctid = '\0';
    cp->csty = '\0';
    pjVar1 = (jpc_dec_ccp_t *)jas_alloc2((long)(int)numcomps,0x380);
    cp->ccps = pjVar1;
    if (pjVar1 != (jpc_dec_ccp_t *)0x0) {
      pjVar2 = jpc_pchglist_create();
      cp->pchglist = pjVar2;
      if (pjVar2 != (jpc_pchglist_t *)0x0) {
        pjVar1 = cp->ccps;
        iVar3 = 0;
        if (0 < cp->numcomps) {
          iVar3 = cp->numcomps;
        }
        while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
          pjVar1->flags = 0;
          pjVar1->numstepsizes = 0;
          pjVar1->numguardbits = '\0';
          pjVar1->roishift = '\0';
          pjVar1->cblkctx = '\0';
          pjVar1->numrlvls = '\0';
          pjVar1->cblkwidthexpn = '\0';
          pjVar1->cblkheightexpn = '\0';
          pjVar1->qmfbid = '\0';
          pjVar1 = pjVar1 + 1;
        }
        return cp;
      }
    }
    jpc_dec_cp_destroy(cp);
  }
  return (jpc_dec_cp_t *)0x0;
}

Assistant:

static jpc_dec_cp_t *jpc_dec_cp_create(uint_fast16_t numcomps)
{
	jpc_dec_cp_t *cp;
	jpc_dec_ccp_t *ccp;
	int compno;

	if (!(cp = jas_malloc(sizeof(jpc_dec_cp_t)))) {
		return 0;
	}
	cp->flags = 0;
	cp->numcomps = numcomps;
	cp->prgord = 0;
	cp->numlyrs = 0;
	cp->mctid = 0;
	cp->csty = 0;
	if (!(cp->ccps = jas_alloc2(cp->numcomps, sizeof(jpc_dec_ccp_t)))) {
		goto error;
	}
	if (!(cp->pchglist = jpc_pchglist_create())) {
		goto error;
	}
	for (compno = 0, ccp = cp->ccps; compno < cp->numcomps;
	  ++compno, ++ccp) {
		ccp->flags = 0;
		ccp->numrlvls = 0;
		ccp->cblkwidthexpn = 0;
		ccp->cblkheightexpn = 0;
		ccp->qmfbid = 0;
		ccp->numstepsizes = 0;
		ccp->numguardbits = 0;
		ccp->roishift = 0;
		ccp->cblkctx = 0;
	}
	return cp;
error:
	if (cp) {
		jpc_dec_cp_destroy(cp);
	}
	return 0;
}